

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSupport.cpp
# Opt level: O2

void TTD::LoadValuesForHashTables
               (uint32 targetSize,uint32 *powerOf2,uint32 *closePrime,uint32 *midPrime)

{
  uint32 uVar1;
  uint32 uVar2;
  uint32 uVar3;
  bool bVar4;
  
  if (targetSize < 0x80) {
    uVar1 = 0x3d;
    uVar2 = 0x7f;
    uVar3 = 0x80;
  }
  else if (targetSize < 0x100) {
    uVar1 = 0x7f;
    uVar2 = 0xfb;
    uVar3 = 0x100;
  }
  else if (targetSize < 0x200) {
    uVar1 = 0xfb;
    uVar2 = 0x1ff;
    uVar3 = 0x200;
  }
  else if (targetSize < 0x400) {
    uVar1 = 0x1ff;
    uVar2 = 0x3fd;
    uVar3 = 0x400;
  }
  else if (targetSize < 0x800) {
    uVar1 = 0x3fd;
    uVar2 = 0x7f7;
    uVar3 = 0x800;
  }
  else if (targetSize < 0x1000) {
    uVar1 = 0x7f7;
    uVar2 = 0xffd;
    uVar3 = 0x1000;
  }
  else if (targetSize < 0x2000) {
    uVar1 = 0xffd;
    uVar2 = 0x1fff;
    uVar3 = 0x2000;
  }
  else if (targetSize < 0x4000) {
    uVar1 = 0x1fff;
    uVar2 = 0x3ffd;
    uVar3 = 0x4000;
  }
  else if (targetSize < 0x8000) {
    uVar1 = 0x3ffd;
    uVar2 = 0x7fed;
    uVar3 = 0x8000;
  }
  else if (targetSize < 0x10000) {
    uVar1 = 0x7fed;
    uVar2 = 0xfff1;
    uVar3 = 0x10000;
  }
  else if (targetSize < 0x20000) {
    uVar1 = 0xfff1;
    uVar2 = 0x1ffff;
    uVar3 = 0x20000;
  }
  else if (targetSize < 0x40000) {
    uVar1 = 0x1ffff;
    uVar2 = 0x3fffb;
    uVar3 = 0x40000;
  }
  else if (targetSize < 0x80000) {
    uVar1 = 0x3fffb;
    uVar2 = 0x7ffff;
    uVar3 = 0x80000;
  }
  else if (targetSize < 0x100000) {
    uVar1 = 0x7ffff;
    uVar2 = 0xffffd;
    uVar3 = 0x100000;
  }
  else if (targetSize < 0x200000) {
    uVar1 = 0xffffd;
    uVar2 = 0x1ffff7;
    uVar3 = 0x200000;
  }
  else if (targetSize < 0x400000) {
    uVar1 = 0x1ffff7;
    uVar2 = 0x3ffffd;
    uVar3 = 0x400000;
  }
  else {
    bVar4 = 0x7fffff < targetSize;
    uVar2 = 0xfffffd;
    if (!bVar4) {
      uVar2 = 0x7ffff1;
    }
    uVar1 = 0x3ffffd;
    if (bVar4) {
      uVar1 = 0x7ffff1;
    }
    uVar3 = (uint)bVar4 * 0x800000 + 0x800000;
  }
  *powerOf2 = uVar3;
  *closePrime = uVar2;
  *midPrime = uVar1;
  return;
}

Assistant:

void LoadValuesForHashTables(uint32 targetSize, uint32* powerOf2, uint32* closePrime, uint32* midPrime)
    {
        TTD_TABLE_FACTORLOAD_BASE(128, 127, 61)

            TTD_TABLE_FACTORLOAD(256, 251, 127)
            TTD_TABLE_FACTORLOAD(512, 511, 251)
            TTD_TABLE_FACTORLOAD(1024, 1021, 511)
            TTD_TABLE_FACTORLOAD(2048, 2039, 1021)
            TTD_TABLE_FACTORLOAD(4096, 4093, 2039)
            TTD_TABLE_FACTORLOAD(8192, 8191, 4093)
            TTD_TABLE_FACTORLOAD(16384, 16381, 8191)
            TTD_TABLE_FACTORLOAD(32768, 32749, 16381)
            TTD_TABLE_FACTORLOAD(65536, 65521, 32749)
            TTD_TABLE_FACTORLOAD(131072, 131071, 65521)
            TTD_TABLE_FACTORLOAD(262144, 262139, 131071)
            TTD_TABLE_FACTORLOAD(524288, 524287, 262139)
            TTD_TABLE_FACTORLOAD(1048576, 1048573, 524287)
            TTD_TABLE_FACTORLOAD(2097152, 2097143, 1048573)
            TTD_TABLE_FACTORLOAD(4194304, 4194301, 2097143)
            TTD_TABLE_FACTORLOAD(8388608, 8388593, 4194301)

        TTD_TABLE_FACTORLOAD_FINAL(16777216, 16777213, 8388593)
    }